

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.hpp
# Opt level: O2

string * __thiscall
FMB::FiniteModelMultiSorted::append
          (string *__return_storage_ptr__,FiniteModelMultiSorted *this,string *name,char *suffix)

{
  char cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  string dequoted;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (name->_M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,suffix,(allocator<char> *)&local_60);
  }
  else {
    cVar1 = *(name->_M_dataplus)._M_p;
    if (cVar1 == '\'') {
      std::__cxx11::string::substr((ulong)&local_60,(ulong)name);
      std::operator+(&local_80,&local_60,suffix);
      std::operator+(__return_storage_ptr__,&local_80,"\'");
      std::__cxx11::string::~string((string *)&local_80);
      this_00 = &local_60;
    }
    else {
      if (cVar1 != '$') {
        std::operator+(__return_storage_ptr__,name,suffix);
        return __return_storage_ptr__;
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"\'",&local_81);
      std::operator+(&local_80,&local_40,name);
      std::operator+(&local_60,&local_80,suffix);
      std::operator+(__return_storage_ptr__,&local_60,"\'");
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      this_00 = &local_40;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string append(std::string name, const char* suffix) {
    if (name.empty()) {
      return std::string(suffix);
    } else if(name[0] == '$') {
      return std::string("'") + name + suffix + "'";
    } else if (name[0] == '\'') {
      std::string dequoted = name.substr(0, name.length() - 1);
      return dequoted + suffix + "'";
    } else {
      return name + suffix;
    }
  }